

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O0

int __thiscall Fl_Window_Type::read_fdesign(Fl_Window_Type *this,char *propname,char *value)

{
  Fl_Widget *pFVar1;
  int iVar2;
  int local_2c;
  char *pcStack_28;
  int x;
  char *value_local;
  char *propname_local;
  Fl_Window_Type *this_local;
  
  pcStack_28 = value;
  value_local = propname;
  propname_local = (char *)this;
  Fl_Widget::box((this->super_Fl_Widget_Type).o,FL_NO_BOX);
  iVar2 = strcmp(value_local,"Width");
  if (iVar2 == 0) {
    iVar2 = __isoc99_sscanf(pcStack_28,"%d",&local_2c);
    if (iVar2 == 1) {
      pFVar1 = (this->super_Fl_Widget_Type).o;
      iVar2 = Fl_Widget::h((this->super_Fl_Widget_Type).o);
      Fl_Widget::size(pFVar1,local_2c,iVar2);
    }
  }
  else {
    iVar2 = strcmp(value_local,"Height");
    if (iVar2 == 0) {
      iVar2 = __isoc99_sscanf(pcStack_28,"%d",&local_2c);
      if (iVar2 == 1) {
        pFVar1 = (this->super_Fl_Widget_Type).o;
        iVar2 = Fl_Widget::w((this->super_Fl_Widget_Type).o);
        Fl_Widget::size(pFVar1,iVar2,local_2c);
      }
    }
    else {
      iVar2 = strcmp(value_local,"NumberofWidgets");
      if (iVar2 == 0) {
        return 1;
      }
      iVar2 = strcmp(value_local,"border");
      if (iVar2 == 0) {
        iVar2 = __isoc99_sscanf(pcStack_28,"%d",&local_2c);
        if (iVar2 == 1) {
          Fl_Window::border((Fl_Window *)(this->super_Fl_Widget_Type).o,local_2c);
        }
      }
      else {
        iVar2 = strcmp(value_local,"title");
        if (iVar2 != 0) {
          iVar2 = Fl_Widget_Type::read_fdesign(&this->super_Fl_Widget_Type,value_local,pcStack_28);
          return iVar2;
        }
        Fl_Type::label((Fl_Type *)this,pcStack_28);
      }
    }
  }
  return 1;
}

Assistant:

int Fl_Window_Type::read_fdesign(const char* propname, const char* value) {
  int x;
  o->box(FL_NO_BOX); // because fdesign always puts an Fl_Box next
  if (!strcmp(propname,"Width")) {
    if (sscanf(value,"%d",&x) == 1) o->size(x,o->h());
  } else if (!strcmp(propname,"Height")) {
    if (sscanf(value,"%d",&x) == 1) o->size(o->w(),x);
  } else if (!strcmp(propname,"NumberofWidgets")) {
    return 1; // we can figure out count from file
  } else if (!strcmp(propname,"border")) {
    if (sscanf(value,"%d",&x) == 1) ((Fl_Window*)o)->border(x);
  } else if (!strcmp(propname,"title")) {
    label(value);
  } else {
    return Fl_Widget_Type::read_fdesign(propname,value);
  }
  return 1;
}